

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *dir,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,TweakMethod *tweak)

{
  TweakMethod *this;
  string *psVar1;
  string *os_00;
  bool bVar2;
  size_type sVar3;
  const_reference str;
  ulong uVar4;
  ostream *poVar5;
  cmAlphaNum local_390;
  cmAlphaNum local_360;
  string local_330;
  string local_310;
  int local_2ec;
  reference local_2e8;
  string *f;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  cmScriptGeneratorIndent local_2c0;
  cmScriptGeneratorIndent local_2bc;
  string local_2b8 [4];
  Indent indent2;
  string tws;
  string local_290;
  Indent local_26c;
  undefined1 local_268 [8];
  ostringstream tw;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  string local_80;
  string local_60;
  Indent local_3c;
  TweakMethod *local_38;
  TweakMethod *tweak_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *dir_local;
  string *config_local;
  ostream *os_local;
  Indent indent_local;
  
  local_38 = tweak;
  tweak_local = (TweakMethod *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)dir;
  dir_local = config;
  config_local = (string *)os;
  os_local._4_4_ = indent.Level;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  os_00 = config_local;
  psVar1 = dir_local;
  if (sVar3 == 1) {
    local_3c.Level = os_local._4_4_;
    cmAlphaNum::cmAlphaNum(&local_b0,(string *)files_local);
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)tweak_local,0);
    cmAlphaNum::cmAlphaNum(&local_e0,str);
    cmStrCat<>(&local_80,&local_b0,&local_e0);
    GetDestDirPath(&local_60,&local_80);
    AddTweak((ostream *)os_00,local_3c,psVar1,&local_60,local_38);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
    local_26c.Level =
         (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&os_local + 4),2);
    psVar1 = dir_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"${file}",(allocator<char> *)(tws.field_2._M_local_buf + 0xf));
    AddTweak((ostream *)local_268,local_26c,psVar1,&local_290,local_38);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)(tws.field_2._M_local_buf + 0xf));
    std::__cxx11::ostringstream::str();
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_2c0 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&os_local + 4),2);
      local_2bc = cmScriptGeneratorIndent::Next(&local_2c0,2);
      poVar5 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)os_local._4_4_);
      std::operator<<(poVar5,"foreach(file\n");
      this = tweak_local;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)tweak_local);
      f = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&f);
        if (!bVar2) break;
        local_2e8 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_2ec = local_2bc.Level;
        poVar5 = ::operator<<((ostream *)config_local,local_2bc);
        poVar5 = std::operator<<(poVar5,"\"");
        cmAlphaNum::cmAlphaNum(&local_360,(string *)files_local);
        cmAlphaNum::cmAlphaNum(&local_390,local_2e8);
        cmStrCat<>(&local_330,&local_360,&local_390);
        GetDestDirPath(&local_310,&local_330);
        poVar5 = std::operator<<(poVar5,(string *)&local_310);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      poVar5 = ::operator<<((ostream *)config_local,local_2bc);
      std::operator<<(poVar5,")\n");
      std::operator<<((ostream *)config_local,local_2b8);
      poVar5 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)os_local._4_4_);
      std::operator<<(poVar5,"endforeach()\n");
    }
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  }
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& dir,
                                  std::vector<std::string> const& files,
                                  const TweakMethod& tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    AddTweak(os, indent, config, GetDestDirPath(cmStrCat(dir, files[0])),
             tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << GetDestDirPath(cmStrCat(dir, f)) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}